

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_pack_16_rr(void)

{
  uint uVar1;
  uint uVar2;
  uint addr_in;
  
  if (((ushort)m68ki_cpu.cpu_type & 0x3f8) != 0) {
    uVar1 = m68ki_cpu.dar[m68ki_cpu.ir & 7];
    my_fc_handler(m68ki_cpu.s_flag | 2);
    addr_in = m68ki_cpu.pc & m68ki_cpu.address_mask;
    m68ki_cpu.pc = m68ki_cpu.pc + 2;
    my_fc_handler(m68ki_cpu.s_flag | 2);
    if (m68ki_cpu.pmmu_enabled != 0) {
      addr_in = pmmu_translate_addr(addr_in);
    }
    uVar2 = m68k_read_memory_16(addr_in & m68ki_cpu.address_mask);
    uVar2 = uVar2 + uVar1;
    *(byte *)((long)m68ki_cpu.dar + (ulong)(m68ki_cpu.ir >> 7 & 0x1c)) =
         (byte)uVar2 & 0xf | (byte)(uVar2 >> 4) & 0xf0;
    return;
  }
  m68ki_exception_illegal();
  return;
}

Assistant:

static void m68k_op_pack_16_rr(void)
{
	if(CPU_TYPE_IS_EC020_PLUS(CPU_TYPE))
	{
		/* Note: DX and DY are reversed in Motorola's docs */
		uint src = DY + OPER_I_16();
		uint* r_dst = &DX;

		*r_dst = MASK_OUT_BELOW_8(*r_dst) | ((src >> 4) & 0x00f0) | (src & 0x000f);
		return;
	}
	m68ki_exception_illegal();
}